

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PendingTermsAddOne(Fts3Table *p,int iCol,int iPos,Fts3Hash *pHash,char *zToken,int nToken)

{
  PendingList *p_00;
  int iVar1;
  PendingList *pPVar2;
  int local_3c;
  PendingList *pList;
  
  local_3c = 0;
  pList = (PendingList *)sqlite3Fts3HashFind(pHash,zToken,nToken);
  if (pList != (PendingList *)0x0) {
    p->nPendingData = (p->nPendingData - (pList->nData + nToken)) + -0x28;
  }
  iVar1 = fts3PendingListAppend(&pList,p->iPrevDocid,(long)iCol,(long)iPos,&local_3c);
  p_00 = pList;
  if ((iVar1 != 0) &&
     (pPVar2 = (PendingList *)sqlite3Fts3HashInsert(pHash,zToken,nToken,pList), p_00 == pPVar2)) {
    sqlite3_free(p_00);
    return 7;
  }
  if (local_3c == 0) {
    p->nPendingData = p->nPendingData + nToken + pList->nData + 0x28;
    local_3c = 0;
  }
  return local_3c;
}

Assistant:

static int fts3PendingTermsAddOne(
  Fts3Table *p,
  int iCol,
  int iPos,
  Fts3Hash *pHash,                /* Pending terms hash table to add entry to */
  const char *zToken,
  int nToken
){
  PendingList *pList;
  int rc = SQLITE_OK;

  pList = (PendingList *)fts3HashFind(pHash, zToken, nToken);
  if( pList ){
    p->nPendingData -= (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  if( fts3PendingListAppend(&pList, p->iPrevDocid, iCol, iPos, &rc) ){
    if( pList==fts3HashInsert(pHash, zToken, nToken, pList) ){
      /* Malloc failed while inserting the new entry. This can only 
      ** happen if there was no previous entry for this token.
      */
      assert( 0==fts3HashFind(pHash, zToken, nToken) );
      sqlite3_free(pList);
      rc = SQLITE_NOMEM;
    }
  }
  if( rc==SQLITE_OK ){
    p->nPendingData += (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  return rc;
}